

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

basic_variable<std::allocator<char>_> * __thiscall
trial::protocol::bintoken::parse<unsigned_char[33],std::allocator<char>>
          (basic_variable<std::allocator<char>_> *__return_storage_ptr__,bintoken *this,
          uchar (*input) [33])

{
  value vVar1;
  error *this_00;
  reader *reader_00;
  UI_STRING *uis;
  reader *this_01;
  undefined1 local_90 [8];
  reader reader;
  uchar (*input_local) [33];
  basic_variable<std::allocator<char>_> *result;
  
  this_01 = (reader *)local_90;
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  bintoken::reader::reader<unsigned_char[33]>(this_01,(uchar (*) [33])this);
  partial::parse<std::allocator<char>>(__return_storage_ptr__,(partial *)this_01,reader_00);
  vVar1 = bintoken::reader::symbol((reader *)local_90);
  if (vVar1 == end) {
    bintoken::reader::~reader((reader *)local_90,(UI *)this_01,uis);
    return __return_storage_ptr__;
  }
  this_00 = (error *)__cxa_allocate_exception(0x20);
  error::error(this_00,unexpected_token);
  __cxa_throw(this_00,&error::typeinfo,error::~error);
}

Assistant:

auto parse(const U& input) -> dynamic::basic_variable<Allocator>
{
    bintoken::reader reader(input);
    auto result = partial::parse(reader);
    if (reader.symbol() != bintoken::token::symbol::end)
        throw bintoken::error(bintoken::unexpected_token);
    return result;
}